

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

int Abc_ObjMvVarNum(Abc_Obj_t *pObj)

{
  void *pvVar1;
  int *piVar2;
  Abc_Obj_t *pObj_local;
  
  pvVar1 = Abc_NtkMvVar(pObj->pNtk);
  if ((pvVar1 != (void *)0x0) && (pvVar1 = Abc_ObjMvVar(pObj), pvVar1 != (void *)0x0)) {
    piVar2 = (int *)Abc_ObjMvVar(pObj);
    return *piVar2;
  }
  return 2;
}

Assistant:

static inline int         Abc_ObjMvVarNum( Abc_Obj_t * pObj )           { return (Abc_NtkMvVar(pObj->pNtk) && Abc_ObjMvVar(pObj))? *((int*)Abc_ObjMvVar(pObj)) : 2; }